

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O0

EStatusCode __thiscall
ShadingWriter::WriteShadingType1Object
          (ShadingWriter *this,PDFRectangle *inBounds,ObjectIDType inShadingObjectId,
          ObjectIDType *outFunctionObjectId)

{
  EStatusCode EVar1;
  IndirectObjectsReferenceRegistry *this_00;
  DictionaryContext *pDVar2;
  allocator<char> local_109;
  EStatusCode status;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  DictionaryContext *local_38;
  DictionaryContext *shadingDict;
  ObjectIDType functionObjectId;
  ObjectIDType *outFunctionObjectId_local;
  ObjectIDType inShadingObjectId_local;
  PDFRectangle *inBounds_local;
  ShadingWriter *this_local;
  
  functionObjectId = (ObjectIDType)outFunctionObjectId;
  outFunctionObjectId_local = (ObjectIDType *)inShadingObjectId;
  inShadingObjectId_local = (ObjectIDType)inBounds;
  inBounds_local = (PDFRectangle *)this;
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  shadingDict = (DictionaryContext *)IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
  ObjectsContext::StartNewIndirectObject
            (this->mObjectsContext,(ObjectIDType)outFunctionObjectId_local);
  pDVar2 = ObjectsContext::StartDictionary(this->mObjectsContext);
  local_38 = pDVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"ShadingType",&local_59);
  DictionaryContext::WriteKey(pDVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  DictionaryContext::WriteIntegerValue(local_38,1);
  pDVar2 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Domain",&local_91);
  DictionaryContext::WriteKey(pDVar2,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  ObjectsContext::StartArray(this->mObjectsContext);
  ObjectsContext::WriteDouble
            (this->mObjectsContext,*(double *)inShadingObjectId_local,eTokenSeparatorSpace);
  ObjectsContext::WriteDouble
            (this->mObjectsContext,*(double *)(inShadingObjectId_local + 0x10),eTokenSeparatorSpace)
  ;
  ObjectsContext::WriteDouble
            (this->mObjectsContext,*(double *)(inShadingObjectId_local + 8),eTokenSeparatorSpace);
  ObjectsContext::WriteDouble
            (this->mObjectsContext,*(double *)(inShadingObjectId_local + 0x18),eTokenSeparatorSpace)
  ;
  ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
  pDVar2 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"ColorSpace",&local_b9);
  DictionaryContext::WriteKey(pDVar2,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pDVar2 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"DeviceRGB",&local_e1);
  DictionaryContext::WriteNameValue(pDVar2,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pDVar2 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&status,"Function",&local_109);
  DictionaryContext::WriteKey(pDVar2,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::allocator<char>::~allocator(&local_109);
  DictionaryContext::WriteNewObjectReferenceValue(local_38,(ObjectIDType)shadingDict);
  EVar1 = ObjectsContext::EndDictionary(this->mObjectsContext,local_38);
  if (EVar1 == eSuccess) {
    ObjectsContext::EndIndirectObject(this->mObjectsContext);
  }
  *(DictionaryContext **)functionObjectId = shadingDict;
  return EVar1;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteShadingType1Object(const PDFRectangle& inBounds, ObjectIDType inShadingObjectId, ObjectIDType& outFunctionObjectId) {
    ObjectIDType functionObjectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

    mObjectsContext->StartNewIndirectObject(inShadingObjectId);
    DictionaryContext* shadingDict = mObjectsContext->StartDictionary();
    shadingDict->WriteKey("ShadingType");
    shadingDict->WriteIntegerValue(1);
    shadingDict->WriteKey("Domain");
    mObjectsContext->StartArray();
    mObjectsContext->WriteDouble(inBounds.LowerLeftX);
    mObjectsContext->WriteDouble(inBounds.UpperRightX);
    mObjectsContext->WriteDouble(inBounds.LowerLeftY);
    mObjectsContext->WriteDouble(inBounds.UpperRightY);
    mObjectsContext->EndArray(eTokenSeparatorEndLine);    
    shadingDict->WriteKey("ColorSpace");
    shadingDict->WriteNameValue("DeviceRGB");
    shadingDict->WriteKey("Function");
    shadingDict->WriteNewObjectReferenceValue(functionObjectId);
    EStatusCode status = mObjectsContext->EndDictionary(shadingDict);
    if(eSuccess == status)
        mObjectsContext->EndIndirectObject();

    outFunctionObjectId = functionObjectId;

    return status;
}